

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

void fs_event_unlink_files(uv_timer_t *handle)

{
  int iVar1;
  char *pcVar2;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int i;
  int r;
  uv_timer_t *handle_local;
  
  if (handle == (uv_timer_t *)0x0) {
    for (eval_a._0_4_ = 0; (int)eval_a < 0x10; eval_a._0_4_ = (int)eval_a + 1) {
      pcVar2 = fs_event_get_filename((int)eval_a);
      remove(pcVar2);
    }
  }
  else {
    if (0xf < (long)fs_event_removed) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
              ,0xb3,"fs_event_removed","<","fs_event_file_count",(long)fs_event_removed,"<",0x10);
      abort();
    }
    pcVar2 = fs_event_get_filename(fs_event_removed);
    iVar1 = remove(pcVar2);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
              ,0xb6,"remove(fs_event_get_filename(fs_event_removed))","==","0",(long)iVar1,"==",0);
      abort();
    }
    fs_event_removed = fs_event_removed + 1;
    if (fs_event_removed < 0x10) {
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
                ,0xbb,"uv_timer_start(&timer, fs_event_unlink_files, 1, 0)","==","0",(long)iVar1,
                "==",0);
        abort();
      }
    }
  }
  return;
}

Assistant:

static void fs_event_unlink_files(uv_timer_t* handle) {
  int r;
  int i;

  /* NOTE: handle might be NULL if invoked not as timer callback */
  if (handle == NULL) {
    /* Unlink all files */
    for (i = 0; i < 16; i++) {
      r = remove(fs_event_get_filename(i));
      if (handle != NULL)
        ASSERT_OK(r);
    }
  } else {
    /* Make sure we're not attempting to remove files we do not intend */
    ASSERT_LT(fs_event_removed, fs_event_file_count);

    /* Remove the file */
    ASSERT_OK(remove(fs_event_get_filename(fs_event_removed)));

    if (++fs_event_removed < fs_event_file_count) {
      /* Remove another file on a different event loop tick.  We do it this way
       * to avoid fs events coalescing into one fs event. */
      ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
    }
  }
}